

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.cpp
# Opt level: O2

uint __thiscall llvm::dwarf::getOperationEncoding(dwarf *this,StringRef OperationEncodingString)

{
  uint uVar1;
  StringSwitch<unsigned_int,_unsigned_int> *pSVar2;
  StringLiteral S;
  StringLiteral S_00;
  StringLiteral S_01;
  StringLiteral S_02;
  StringLiteral S_03;
  StringLiteral S_04;
  StringLiteral S_05;
  StringLiteral S_06;
  StringLiteral S_07;
  StringLiteral S_08;
  StringLiteral S_09;
  StringLiteral S_10;
  StringLiteral S_11;
  StringLiteral S_12;
  StringLiteral S_13;
  StringLiteral S_14;
  StringLiteral S_15;
  StringLiteral S_16;
  StringLiteral S_17;
  StringLiteral S_18;
  StringLiteral S_19;
  StringLiteral S_20;
  StringLiteral S_21;
  StringLiteral S_22;
  StringLiteral S_23;
  StringLiteral S_24;
  StringLiteral S_25;
  StringLiteral S_26;
  StringLiteral S_27;
  StringLiteral S_28;
  StringLiteral S_29;
  StringLiteral S_30;
  StringLiteral S_31;
  StringLiteral S_32;
  StringLiteral S_33;
  StringLiteral S_34;
  StringLiteral S_35;
  StringLiteral S_36;
  StringLiteral S_37;
  StringLiteral S_38;
  StringLiteral S_39;
  StringLiteral S_40;
  StringLiteral S_41;
  StringLiteral S_42;
  StringLiteral S_43;
  StringLiteral S_44;
  StringLiteral S_45;
  StringLiteral S_46;
  StringLiteral S_47;
  StringLiteral S_48;
  StringLiteral S_49;
  StringLiteral S_50;
  StringLiteral S_51;
  StringLiteral S_52;
  StringLiteral S_53;
  StringLiteral S_54;
  StringLiteral S_55;
  StringLiteral S_56;
  StringLiteral S_57;
  StringLiteral S_58;
  StringLiteral S_59;
  StringLiteral S_60;
  StringLiteral S_61;
  StringLiteral S_62;
  StringLiteral S_63;
  StringLiteral S_64;
  StringLiteral S_65;
  StringLiteral S_66;
  StringLiteral S_67;
  StringLiteral S_68;
  StringLiteral S_69;
  StringLiteral S_70;
  StringLiteral S_71;
  StringLiteral S_72;
  StringLiteral S_73;
  StringLiteral S_74;
  StringLiteral S_75;
  StringLiteral S_76;
  StringLiteral S_77;
  StringLiteral S_78;
  StringLiteral S_79;
  StringLiteral S_80;
  StringLiteral S_81;
  StringLiteral S_82;
  StringLiteral S_83;
  StringLiteral S_84;
  StringLiteral S_85;
  StringLiteral S_86;
  StringLiteral S_87;
  StringLiteral S_88;
  StringLiteral S_89;
  StringLiteral S_90;
  StringLiteral S_91;
  StringLiteral S_92;
  StringLiteral S_93;
  StringLiteral S_94;
  StringLiteral S_95;
  StringLiteral S_96;
  StringLiteral S_97;
  StringLiteral S_98;
  StringLiteral S_99;
  StringLiteral S_x00100;
  StringLiteral S_x00101;
  StringLiteral S_x00102;
  StringLiteral S_x00103;
  StringLiteral S_x00104;
  StringLiteral S_x00105;
  StringLiteral S_x00106;
  StringLiteral S_x00107;
  StringLiteral S_x00108;
  StringLiteral S_x00109;
  StringLiteral S_x00110;
  StringLiteral S_x00111;
  StringLiteral S_x00112;
  StringLiteral S_x00113;
  StringLiteral S_x00114;
  StringLiteral S_x00115;
  StringLiteral S_x00116;
  StringLiteral S_x00117;
  StringLiteral S_x00118;
  StringLiteral S_x00119;
  StringLiteral S_x00120;
  StringLiteral S_x00121;
  StringLiteral S_x00122;
  StringLiteral S_x00123;
  StringLiteral S_x00124;
  StringLiteral S_x00125;
  StringLiteral S_x00126;
  StringLiteral S_x00127;
  StringLiteral S_x00128;
  StringLiteral S_x00129;
  StringLiteral S_x00130;
  StringLiteral S_x00131;
  StringLiteral S_x00132;
  StringLiteral S_x00133;
  StringLiteral S_x00134;
  StringLiteral S_x00135;
  StringLiteral S_x00136;
  StringLiteral S_x00137;
  StringLiteral S_x00138;
  StringLiteral S_x00139;
  StringLiteral S_x00140;
  StringLiteral S_x00141;
  StringLiteral S_x00142;
  StringLiteral S_x00143;
  StringLiteral S_x00144;
  StringLiteral S_x00145;
  StringLiteral S_x00146;
  StringLiteral S_x00147;
  StringLiteral S_x00148;
  StringLiteral S_x00149;
  StringLiteral S_x00150;
  StringLiteral S_x00151;
  StringLiteral S_x00152;
  StringLiteral S_x00153;
  StringLiteral S_x00154;
  StringLiteral S_x00155;
  StringLiteral S_x00156;
  StringLiteral S_x00157;
  StringLiteral S_x00158;
  StringLiteral S_x00159;
  StringLiteral S_x00160;
  StringLiteral S_x00161;
  StringLiteral S_x00162;
  StringLiteral S_x00163;
  StringLiteral S_x00164;
  StringLiteral S_x00165;
  StringLiteral S_x00166;
  StringLiteral S_x00167;
  StringLiteral S_x00168;
  StringLiteral S_x00169;
  StringLiteral S_x00170;
  StringLiteral S_x00171;
  StringSwitch<unsigned_int,_unsigned_int> local_48;
  
  local_48.Str.Length = (size_t)OperationEncodingString.Data;
  local_48.Result.Storage.field_0.empty = '\0';
  local_48.Result.Storage.hasVal = false;
  S.super_StringRef.Length = 10;
  S.super_StringRef.Data = "DW_OP_addr";
  local_48.Str.Data = (char *)this;
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(&local_48,S,3);
  S_00.super_StringRef.Length = 0xb;
  S_00.super_StringRef.Data = "DW_OP_deref";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_00,6);
  S_01.super_StringRef.Length = 0xd;
  S_01.super_StringRef.Data = "DW_OP_const1u";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_01,8);
  S_02.super_StringRef.Length = 0xd;
  S_02.super_StringRef.Data = "DW_OP_const1s";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_02,9);
  S_03.super_StringRef.Length = 0xd;
  S_03.super_StringRef.Data = "DW_OP_const2u";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_03,10);
  S_04.super_StringRef.Length = 0xd;
  S_04.super_StringRef.Data = "DW_OP_const2s";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_04,0xb);
  S_05.super_StringRef.Length = 0xd;
  S_05.super_StringRef.Data = "DW_OP_const4u";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_05,0xc);
  S_06.super_StringRef.Length = 0xd;
  S_06.super_StringRef.Data = "DW_OP_const4s";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_06,0xd);
  S_07.super_StringRef.Length = 0xd;
  S_07.super_StringRef.Data = "DW_OP_const8u";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_07,0xe);
  S_08.super_StringRef.Length = 0xd;
  S_08.super_StringRef.Data = "DW_OP_const8s";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_08,0xf);
  S_09.super_StringRef.Length = 0xc;
  S_09.super_StringRef.Data = "DW_OP_constu";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_09,0x10);
  S_10.super_StringRef.Length = 0xc;
  S_10.super_StringRef.Data = "DW_OP_consts";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_10,0x11);
  S_11.super_StringRef.Length = 9;
  S_11.super_StringRef.Data = "DW_OP_dup";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_11,0x12);
  S_12.super_StringRef.Length = 10;
  S_12.super_StringRef.Data = "DW_OP_drop";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_12,0x13);
  S_13.super_StringRef.Length = 10;
  S_13.super_StringRef.Data = "DW_OP_over";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_13,0x14);
  S_14.super_StringRef.Length = 10;
  S_14.super_StringRef.Data = "DW_OP_pick";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_14,0x15);
  S_15.super_StringRef.Length = 10;
  S_15.super_StringRef.Data = "DW_OP_swap";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_15,0x16);
  S_16.super_StringRef.Length = 9;
  S_16.super_StringRef.Data = "DW_OP_rot";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_16,0x17);
  S_17.super_StringRef.Length = 0xc;
  S_17.super_StringRef.Data = "DW_OP_xderef";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_17,0x18);
  S_18.super_StringRef.Length = 9;
  S_18.super_StringRef.Data = "DW_OP_abs";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_18,0x19);
  S_19.super_StringRef.Length = 9;
  S_19.super_StringRef.Data = "DW_OP_and";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_19,0x1a);
  S_20.super_StringRef.Length = 9;
  S_20.super_StringRef.Data = "DW_OP_div";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_20,0x1b);
  S_21.super_StringRef.Length = 0xb;
  S_21.super_StringRef.Data = "DW_OP_minus";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_21,0x1c);
  S_22.super_StringRef.Length = 9;
  S_22.super_StringRef.Data = "DW_OP_mod";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_22,0x1d);
  S_23.super_StringRef.Length = 9;
  S_23.super_StringRef.Data = "DW_OP_mul";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_23,0x1e);
  S_24.super_StringRef.Length = 9;
  S_24.super_StringRef.Data = "DW_OP_neg";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_24,0x1f);
  S_25.super_StringRef.Length = 9;
  S_25.super_StringRef.Data = "DW_OP_not";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_25,0x20);
  S_26.super_StringRef.Length = 8;
  S_26.super_StringRef.Data = "DW_OP_or";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_26,0x21);
  S_27.super_StringRef.Length = 10;
  S_27.super_StringRef.Data = "DW_OP_plus";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_27,0x22);
  S_28.super_StringRef.Length = 0x11;
  S_28.super_StringRef.Data = "DW_OP_plus_uconst";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_28,0x23);
  S_29.super_StringRef.Length = 9;
  S_29.super_StringRef.Data = "DW_OP_shl";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_29,0x24);
  S_30.super_StringRef.Length = 9;
  S_30.super_StringRef.Data = "DW_OP_shr";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_30,0x25);
  S_31.super_StringRef.Length = 10;
  S_31.super_StringRef.Data = "DW_OP_shra";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_31,0x26);
  S_32.super_StringRef.Length = 9;
  S_32.super_StringRef.Data = "DW_OP_xor";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_32,0x27);
  S_33.super_StringRef.Length = 9;
  S_33.super_StringRef.Data = "DW_OP_bra";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_33,0x28);
  S_34.super_StringRef.Length = 8;
  S_34.super_StringRef.Data = "DW_OP_eq";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_34,0x29);
  S_35.super_StringRef.Length = 8;
  S_35.super_StringRef.Data = "DW_OP_ge";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_35,0x2a);
  S_36.super_StringRef.Length = 8;
  S_36.super_StringRef.Data = "DW_OP_gt";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_36,0x2b);
  S_37.super_StringRef.Length = 8;
  S_37.super_StringRef.Data = "DW_OP_le";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_37,0x2c);
  S_38.super_StringRef.Length = 8;
  S_38.super_StringRef.Data = "DW_OP_lt";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_38,0x2d);
  S_39.super_StringRef.Length = 8;
  S_39.super_StringRef.Data = "DW_OP_ne";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_39,0x2e);
  S_40.super_StringRef.Length = 10;
  S_40.super_StringRef.Data = "DW_OP_skip";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_40,0x2f);
  S_41.super_StringRef.Length = 10;
  S_41.super_StringRef.Data = "DW_OP_lit0";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_41,0x30);
  S_42.super_StringRef.Length = 10;
  S_42.super_StringRef.Data = "DW_OP_lit1";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_42,0x31);
  S_43.super_StringRef.Length = 10;
  S_43.super_StringRef.Data = "DW_OP_lit2";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_43,0x32);
  S_44.super_StringRef.Length = 10;
  S_44.super_StringRef.Data = "DW_OP_lit3";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_44,0x33);
  S_45.super_StringRef.Length = 10;
  S_45.super_StringRef.Data = "DW_OP_lit4";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_45,0x34);
  S_46.super_StringRef.Length = 10;
  S_46.super_StringRef.Data = "DW_OP_lit5";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_46,0x35);
  S_47.super_StringRef.Length = 10;
  S_47.super_StringRef.Data = "DW_OP_lit6";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_47,0x36);
  S_48.super_StringRef.Length = 10;
  S_48.super_StringRef.Data = "DW_OP_lit7";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_48,0x37);
  S_49.super_StringRef.Length = 10;
  S_49.super_StringRef.Data = "DW_OP_lit8";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_49,0x38);
  S_50.super_StringRef.Length = 10;
  S_50.super_StringRef.Data = "DW_OP_lit9";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_50,0x39);
  S_51.super_StringRef.Length = 0xb;
  S_51.super_StringRef.Data = "DW_OP_lit10";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_51,0x3a);
  S_52.super_StringRef.Length = 0xb;
  S_52.super_StringRef.Data = "DW_OP_lit11";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_52,0x3b);
  S_53.super_StringRef.Length = 0xb;
  S_53.super_StringRef.Data = "DW_OP_lit12";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_53,0x3c);
  S_54.super_StringRef.Length = 0xb;
  S_54.super_StringRef.Data = "DW_OP_lit13";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_54,0x3d);
  S_55.super_StringRef.Length = 0xb;
  S_55.super_StringRef.Data = "DW_OP_lit14";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_55,0x3e);
  S_56.super_StringRef.Length = 0xb;
  S_56.super_StringRef.Data = "DW_OP_lit15";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_56,0x3f);
  S_57.super_StringRef.Length = 0xb;
  S_57.super_StringRef.Data = "DW_OP_lit16";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_57,0x40);
  S_58.super_StringRef.Length = 0xb;
  S_58.super_StringRef.Data = "DW_OP_lit17";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_58,0x41);
  S_59.super_StringRef.Length = 0xb;
  S_59.super_StringRef.Data = "DW_OP_lit18";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_59,0x42);
  S_60.super_StringRef.Length = 0xb;
  S_60.super_StringRef.Data = "DW_OP_lit19";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_60,0x43);
  S_61.super_StringRef.Length = 0xb;
  S_61.super_StringRef.Data = "DW_OP_lit20";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_61,0x44);
  S_62.super_StringRef.Length = 0xb;
  S_62.super_StringRef.Data = "DW_OP_lit21";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_62,0x45);
  S_63.super_StringRef.Length = 0xb;
  S_63.super_StringRef.Data = "DW_OP_lit22";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_63,0x46);
  S_64.super_StringRef.Length = 0xb;
  S_64.super_StringRef.Data = "DW_OP_lit23";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_64,0x47);
  S_65.super_StringRef.Length = 0xb;
  S_65.super_StringRef.Data = "DW_OP_lit24";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_65,0x48);
  S_66.super_StringRef.Length = 0xb;
  S_66.super_StringRef.Data = "DW_OP_lit25";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_66,0x49);
  S_67.super_StringRef.Length = 0xb;
  S_67.super_StringRef.Data = "DW_OP_lit26";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_67,0x4a);
  S_68.super_StringRef.Length = 0xb;
  S_68.super_StringRef.Data = "DW_OP_lit27";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_68,0x4b);
  S_69.super_StringRef.Length = 0xb;
  S_69.super_StringRef.Data = "DW_OP_lit28";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_69,0x4c);
  S_70.super_StringRef.Length = 0xb;
  S_70.super_StringRef.Data = "DW_OP_lit29";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_70,0x4d);
  S_71.super_StringRef.Length = 0xb;
  S_71.super_StringRef.Data = "DW_OP_lit30";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_71,0x4e);
  S_72.super_StringRef.Length = 0xb;
  S_72.super_StringRef.Data = "DW_OP_lit31";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_72,0x4f);
  S_73.super_StringRef.Length = 10;
  S_73.super_StringRef.Data = "DW_OP_reg0";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_73,0x50);
  S_74.super_StringRef.Length = 10;
  S_74.super_StringRef.Data = "DW_OP_reg1";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_74,0x51);
  S_75.super_StringRef.Length = 10;
  S_75.super_StringRef.Data = "DW_OP_reg2";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_75,0x52);
  S_76.super_StringRef.Length = 10;
  S_76.super_StringRef.Data = "DW_OP_reg3";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_76,0x53);
  S_77.super_StringRef.Length = 10;
  S_77.super_StringRef.Data = "DW_OP_reg4";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_77,0x54);
  S_78.super_StringRef.Length = 10;
  S_78.super_StringRef.Data = "DW_OP_reg5";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_78,0x55);
  S_79.super_StringRef.Length = 10;
  S_79.super_StringRef.Data = "DW_OP_reg6";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_79,0x56);
  S_80.super_StringRef.Length = 10;
  S_80.super_StringRef.Data = "DW_OP_reg7";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_80,0x57);
  S_81.super_StringRef.Length = 10;
  S_81.super_StringRef.Data = "DW_OP_reg8";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_81,0x58);
  S_82.super_StringRef.Length = 10;
  S_82.super_StringRef.Data = "DW_OP_reg9";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_82,0x59);
  S_83.super_StringRef.Length = 0xb;
  S_83.super_StringRef.Data = "DW_OP_reg10";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_83,0x5a);
  S_84.super_StringRef.Length = 0xb;
  S_84.super_StringRef.Data = "DW_OP_reg11";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_84,0x5b);
  S_85.super_StringRef.Length = 0xb;
  S_85.super_StringRef.Data = "DW_OP_reg12";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_85,0x5c);
  S_86.super_StringRef.Length = 0xb;
  S_86.super_StringRef.Data = "DW_OP_reg13";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_86,0x5d);
  S_87.super_StringRef.Length = 0xb;
  S_87.super_StringRef.Data = "DW_OP_reg14";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_87,0x5e);
  S_88.super_StringRef.Length = 0xb;
  S_88.super_StringRef.Data = "DW_OP_reg15";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_88,0x5f);
  S_89.super_StringRef.Length = 0xb;
  S_89.super_StringRef.Data = "DW_OP_reg16";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_89,0x60);
  S_90.super_StringRef.Length = 0xb;
  S_90.super_StringRef.Data = "DW_OP_reg17";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_90,0x61);
  S_91.super_StringRef.Length = 0xb;
  S_91.super_StringRef.Data = "DW_OP_reg18";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_91,0x62);
  S_92.super_StringRef.Length = 0xb;
  S_92.super_StringRef.Data = "DW_OP_reg19";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_92,99);
  S_93.super_StringRef.Length = 0xb;
  S_93.super_StringRef.Data = "DW_OP_reg20";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_93,100);
  S_94.super_StringRef.Length = 0xb;
  S_94.super_StringRef.Data = "DW_OP_reg21";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_94,0x65);
  S_95.super_StringRef.Length = 0xb;
  S_95.super_StringRef.Data = "DW_OP_reg22";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_95,0x66);
  S_96.super_StringRef.Length = 0xb;
  S_96.super_StringRef.Data = "DW_OP_reg23";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_96,0x67);
  S_97.super_StringRef.Length = 0xb;
  S_97.super_StringRef.Data = "DW_OP_reg24";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_97,0x68);
  S_98.super_StringRef.Length = 0xb;
  S_98.super_StringRef.Data = "DW_OP_reg25";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_98,0x69);
  S_99.super_StringRef.Length = 0xb;
  S_99.super_StringRef.Data = "DW_OP_reg26";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_99,0x6a);
  S_x00100.super_StringRef.Length = 0xb;
  S_x00100.super_StringRef.Data = "DW_OP_reg27";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00100,0x6b);
  S_x00101.super_StringRef.Length = 0xb;
  S_x00101.super_StringRef.Data = "DW_OP_reg28";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00101,0x6c);
  S_x00102.super_StringRef.Length = 0xb;
  S_x00102.super_StringRef.Data = "DW_OP_reg29";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00102,0x6d);
  S_x00103.super_StringRef.Length = 0xb;
  S_x00103.super_StringRef.Data = "DW_OP_reg30";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00103,0x6e);
  S_x00104.super_StringRef.Length = 0xb;
  S_x00104.super_StringRef.Data = "DW_OP_reg31";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00104,0x6f);
  S_x00105.super_StringRef.Length = 0xb;
  S_x00105.super_StringRef.Data = "DW_OP_breg0";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00105,0x70);
  S_x00106.super_StringRef.Length = 0xb;
  S_x00106.super_StringRef.Data = "DW_OP_breg1";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00106,0x71);
  S_x00107.super_StringRef.Length = 0xb;
  S_x00107.super_StringRef.Data = "DW_OP_breg2";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00107,0x72);
  S_x00108.super_StringRef.Length = 0xb;
  S_x00108.super_StringRef.Data = "DW_OP_breg3";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00108,0x73);
  S_x00109.super_StringRef.Length = 0xb;
  S_x00109.super_StringRef.Data = "DW_OP_breg4";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00109,0x74);
  S_x00110.super_StringRef.Length = 0xb;
  S_x00110.super_StringRef.Data = "DW_OP_breg5";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00110,0x75);
  S_x00111.super_StringRef.Length = 0xb;
  S_x00111.super_StringRef.Data = "DW_OP_breg6";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00111,0x76);
  S_x00112.super_StringRef.Length = 0xb;
  S_x00112.super_StringRef.Data = "DW_OP_breg7";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00112,0x77);
  S_x00113.super_StringRef.Length = 0xb;
  S_x00113.super_StringRef.Data = "DW_OP_breg8";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00113,0x78);
  S_x00114.super_StringRef.Length = 0xb;
  S_x00114.super_StringRef.Data = "DW_OP_breg9";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00114,0x79);
  S_x00115.super_StringRef.Length = 0xc;
  S_x00115.super_StringRef.Data = "DW_OP_breg10";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00115,0x7a);
  S_x00116.super_StringRef.Length = 0xc;
  S_x00116.super_StringRef.Data = "DW_OP_breg11";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00116,0x7b);
  S_x00117.super_StringRef.Length = 0xc;
  S_x00117.super_StringRef.Data = "DW_OP_breg12";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00117,0x7c);
  S_x00118.super_StringRef.Length = 0xc;
  S_x00118.super_StringRef.Data = "DW_OP_breg13";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00118,0x7d);
  S_x00119.super_StringRef.Length = 0xc;
  S_x00119.super_StringRef.Data = "DW_OP_breg14";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00119,0x7e);
  S_x00120.super_StringRef.Length = 0xc;
  S_x00120.super_StringRef.Data = "DW_OP_breg15";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00120,0x7f);
  S_x00121.super_StringRef.Length = 0xc;
  S_x00121.super_StringRef.Data = "DW_OP_breg16";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00121,0x80);
  S_x00122.super_StringRef.Length = 0xc;
  S_x00122.super_StringRef.Data = "DW_OP_breg17";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00122,0x81);
  S_x00123.super_StringRef.Length = 0xc;
  S_x00123.super_StringRef.Data = "DW_OP_breg18";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00123,0x82);
  S_x00124.super_StringRef.Length = 0xc;
  S_x00124.super_StringRef.Data = "DW_OP_breg19";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00124,0x83);
  S_x00125.super_StringRef.Length = 0xc;
  S_x00125.super_StringRef.Data = "DW_OP_breg20";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00125,0x84);
  S_x00126.super_StringRef.Length = 0xc;
  S_x00126.super_StringRef.Data = "DW_OP_breg21";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00126,0x85);
  S_x00127.super_StringRef.Length = 0xc;
  S_x00127.super_StringRef.Data = "DW_OP_breg22";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00127,0x86);
  S_x00128.super_StringRef.Length = 0xc;
  S_x00128.super_StringRef.Data = "DW_OP_breg23";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00128,0x87);
  S_x00129.super_StringRef.Length = 0xc;
  S_x00129.super_StringRef.Data = "DW_OP_breg24";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00129,0x88);
  S_x00130.super_StringRef.Length = 0xc;
  S_x00130.super_StringRef.Data = "DW_OP_breg25";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00130,0x89);
  S_x00131.super_StringRef.Length = 0xc;
  S_x00131.super_StringRef.Data = "DW_OP_breg26";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00131,0x8a);
  S_x00132.super_StringRef.Length = 0xc;
  S_x00132.super_StringRef.Data = "DW_OP_breg27";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00132,0x8b);
  S_x00133.super_StringRef.Length = 0xc;
  S_x00133.super_StringRef.Data = "DW_OP_breg28";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00133,0x8c);
  S_x00134.super_StringRef.Length = 0xc;
  S_x00134.super_StringRef.Data = "DW_OP_breg29";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00134,0x8d);
  S_x00135.super_StringRef.Length = 0xc;
  S_x00135.super_StringRef.Data = "DW_OP_breg30";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00135,0x8e);
  S_x00136.super_StringRef.Length = 0xc;
  S_x00136.super_StringRef.Data = "DW_OP_breg31";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00136,0x8f);
  S_x00137.super_StringRef.Length = 10;
  S_x00137.super_StringRef.Data = "DW_OP_regx";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00137,0x90);
  S_x00138.super_StringRef.Length = 0xb;
  S_x00138.super_StringRef.Data = "DW_OP_fbreg";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00138,0x91);
  S_x00139.super_StringRef.Length = 0xb;
  S_x00139.super_StringRef.Data = "DW_OP_bregx";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00139,0x92);
  S_x00140.super_StringRef.Length = 0xb;
  S_x00140.super_StringRef.Data = "DW_OP_piece";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00140,0x93);
  S_x00141.super_StringRef.Length = 0x10;
  S_x00141.super_StringRef.Data = "DW_OP_deref_size";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00141,0x94);
  S_x00142.super_StringRef.Length = 0x11;
  S_x00142.super_StringRef.Data = "DW_OP_xderef_size";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00142,0x95);
  S_x00143.super_StringRef.Length = 9;
  S_x00143.super_StringRef.Data = "DW_OP_nop";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00143,0x96);
  S_x00144.super_StringRef.Length = 0x19;
  S_x00144.super_StringRef.Data = "DW_OP_push_object_address";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00144,0x97);
  S_x00145.super_StringRef.Length = 0xb;
  S_x00145.super_StringRef.Data = "DW_OP_call2";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00145,0x98);
  S_x00146.super_StringRef.Length = 0xb;
  S_x00146.super_StringRef.Data = "DW_OP_call4";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00146,0x99);
  S_x00147.super_StringRef.Length = 0xe;
  S_x00147.super_StringRef.Data = "DW_OP_call_ref";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00147,0x9a);
  S_x00148.super_StringRef.Length = 0x16;
  S_x00148.super_StringRef.Data = "DW_OP_form_tls_address";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00148,0x9b);
  S_x00149.super_StringRef.Length = 0x14;
  S_x00149.super_StringRef.Data = "DW_OP_call_frame_cfa";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00149,0x9c);
  S_x00150.super_StringRef.Length = 0xf;
  S_x00150.super_StringRef.Data = "DW_OP_bit_piece";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00150,0x9d);
  S_x00151.super_StringRef.Length = 0x14;
  S_x00151.super_StringRef.Data = "DW_OP_implicit_value";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00151,0x9e);
  S_x00152.super_StringRef.Length = 0x11;
  S_x00152.super_StringRef.Data = "DW_OP_stack_value";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00152,0x9f);
  S_x00153.super_StringRef.Length = 0x16;
  S_x00153.super_StringRef.Data = "DW_OP_implicit_pointer";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00153,0xa0);
  S_x00154.super_StringRef.Length = 0xb;
  S_x00154.super_StringRef.Data = "DW_OP_addrx";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00154,0xa1);
  S_x00155.super_StringRef.Length = 0xc;
  S_x00155.super_StringRef.Data = "DW_OP_constx";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00155,0xa2);
  S_x00156.super_StringRef.Length = 0x11;
  S_x00156.super_StringRef.Data = "DW_OP_entry_value";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00156,0xa3);
  S_x00157.super_StringRef.Length = 0x10;
  S_x00157.super_StringRef.Data = "DW_OP_const_type";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00157,0xa4);
  S_x00158.super_StringRef.Length = 0x11;
  S_x00158.super_StringRef.Data = "DW_OP_regval_type";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00158,0xa5);
  S_x00159.super_StringRef.Length = 0x10;
  S_x00159.super_StringRef.Data = "DW_OP_deref_type";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00159,0xa6);
  S_x00160.super_StringRef.Length = 0x11;
  S_x00160.super_StringRef.Data = "DW_OP_xderef_type";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00160,0xa7);
  S_x00161.super_StringRef.Length = 0xd;
  S_x00161.super_StringRef.Data = "DW_OP_convert";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00161,0xa8);
  S_x00162.super_StringRef.Length = 0x11;
  S_x00162.super_StringRef.Data = "DW_OP_reinterpret";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00162,0xa9);
  S_x00163.super_StringRef.Length = 0x1a;
  S_x00163.super_StringRef.Data = "DW_OP_GNU_push_tls_address";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00163,0xe0);
  S_x00164.super_StringRef.Length = 0x13;
  S_x00164.super_StringRef.Data = "DW_OP_WASM_location";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00164,0xed);
  S_x00165.super_StringRef.Length = 0x15;
  S_x00165.super_StringRef.Data = "DW_OP_GNU_entry_value";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00165,0xf3);
  S_x00166.super_StringRef.Length = 0x14;
  S_x00166.super_StringRef.Data = "DW_OP_GNU_addr_index";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00166,0xfb);
  S_x00167.super_StringRef.Length = 0x15;
  S_x00167.super_StringRef.Data = "DW_OP_GNU_const_index";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00167,0xfc);
  S_x00168.super_StringRef.Length = 0x12;
  S_x00168.super_StringRef.Data = "DW_OP_LLVM_convert";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00168,0x1001);
  S_x00169.super_StringRef.Length = 0x13;
  S_x00169.super_StringRef.Data = "DW_OP_LLVM_fragment";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00169,0x1000);
  S_x00170.super_StringRef.Length = 0x15;
  S_x00170.super_StringRef.Data = "DW_OP_LLVM_tag_offset";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00170,0x1002);
  S_x00171.super_StringRef.Length = 0x16;
  S_x00171.super_StringRef.Data = "DW_OP_LLVM_entry_value";
  pSVar2 = StringSwitch<unsigned_int,_unsigned_int>::Case(pSVar2,S_x00171,0x1003);
  uVar1 = StringSwitch<unsigned_int,_unsigned_int>::Default(pSVar2,0);
  return uVar1;
}

Assistant:

unsigned llvm::dwarf::getOperationEncoding(StringRef OperationEncodingString) {
  return StringSwitch<unsigned>(OperationEncodingString)
#define HANDLE_DW_OP(ID, NAME, VERSION, VENDOR)                                \
  .Case("DW_OP_" #NAME, DW_OP_##NAME)
#include "llvm/BinaryFormat/Dwarf.def"
      .Case("DW_OP_LLVM_convert", DW_OP_LLVM_convert)
      .Case("DW_OP_LLVM_fragment", DW_OP_LLVM_fragment)
      .Case("DW_OP_LLVM_tag_offset", DW_OP_LLVM_tag_offset)
      .Case("DW_OP_LLVM_entry_value", DW_OP_LLVM_entry_value)
      .Default(0);
}